

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O0

string * __thiscall
MultiAgentDecisionProcessDiscrete::SoftPrint_abi_cxx11_(MultiAgentDecisionProcessDiscrete *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  MADPComponentDiscreteStates *in_stack_000000e8;
  MADPComponentDiscreteActions *in_stack_000000f8;
  stringstream ss;
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [48];
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [224];
  MADPComponentDiscreteObservations *in_stack_ffffffffffffff58;
  MultiAgentDecisionProcess *in_stack_ffffffffffffff78;
  
  std::__cxx11::stringstream::stringstream(local_198);
  MultiAgentDecisionProcess::SoftPrint_abi_cxx11_(in_stack_ffffffffffffff78);
  std::operator<<(local_188,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  MADPComponentDiscreteStates::SoftPrint_abi_cxx11_(in_stack_000000e8);
  std::operator<<(local_188,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  MADPComponentDiscreteActions::SoftPrint_abi_cxx11_(in_stack_000000f8);
  std::operator<<(local_188,local_208);
  std::__cxx11::string::~string(local_208);
  MADPComponentDiscreteObservations::SoftPrint_abi_cxx11_(in_stack_ffffffffffffff58);
  std::operator<<(local_188,local_228);
  std::__cxx11::string::~string(local_228);
  if ((*(byte *)(in_RSI + 0x1e0) & 1) != 0) {
    poVar1 = std::operator<<(local_188,"Transition model: ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    (**(code **)(**(long **)(in_RSI + 0x1e8) + 0x18))(local_248);
    std::operator<<(local_188,local_248);
    std::__cxx11::string::~string(local_248);
    poVar1 = std::operator<<(local_188,"Observation model: ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    (**(code **)(**(long **)(in_RSI + 0x1f0) + 0x18))(local_268);
    std::operator<<(local_188,local_268);
    std::__cxx11::string::~string(local_268);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string MultiAgentDecisionProcessDiscrete::SoftPrint() const
{
    stringstream ss;

    ss << MultiAgentDecisionProcess::SoftPrint();
    ss << _m_S.SoftPrint();
    ss << _m_A.SoftPrint();
    ss << _m_O.SoftPrint();   
   
    if(_m_initialized)
    {
        ss << "Transition model: " << endl;
        ss << _m_p_tModel->SoftPrint();
        ss << "Observation model: " << endl;
        ss << _m_p_oModel->SoftPrint();
    }
    return(ss.str());
}